

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void __thiscall depspawn::internal::EnvInitClass::EnvInitClass(EnvInitClass *this)

{
  char *pcVar1;
  invalid_argument *piVar2;
  long lVar3;
  char *env_var;
  undefined8 in_stack_ffffffffffffffc0;
  int local_38;
  int local_28;
  
  pcVar1 = getenv("DEPSPAWN_NUM_THREADS");
  if (pcVar1 == (char *)0x0) {
    local_28 = std::thread::hardware_concurrency();
  }
  else {
    lVar3 = strtol(pcVar1,(char **)0x0,0);
    local_28 = (int)lVar3;
  }
  Nthreads = local_28;
  if (local_28 < 1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Invalid DEPSPAWN_NUM_THREADS");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  set_threads((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  pcVar1 = getenv("DEPSPAWN_ENQUEUE_TASKS");
  EnqueueTasks = pcVar1 != (char *)0x0;
  pcVar1 = getenv("DEPSPAWN_TASK_QUEUE_LIMIT");
  FAST_THRESHOLD_ExplicitlySet = pcVar1 != (char *)0x0;
  if ((bool)FAST_THRESHOLD_ExplicitlySet) {
    lVar3 = strtol(pcVar1,(char **)0x0,0);
    local_38 = (int)lVar3;
  }
  else {
    local_38 = Nthreads << 1;
  }
  FAST_THRESHOLD = local_38;
  if (local_38 < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Invalid DEPSPAWN_TASK_QUEUE_LIMIT");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

EnvInitClass::EnvInitClass()
    {
      const char *env_var = getenv("DEPSPAWN_NUM_THREADS");
      Nthreads = (env_var == nullptr) ? std::thread::hardware_concurrency() : strtol(env_var, 0, 0);
      if (Nthreads <= 0) {
        throw std::invalid_argument("Invalid DEPSPAWN_NUM_THREADS");
      }

      // since set_threads sets a default set_task_queue_limit
      //we call it here in case DEPSPAWN_TASK_QUEUE_LIMIT modifies it also
      set_threads(Nthreads);
      
      env_var = getenv("DEPSPAWN_ENQUEUE_TASKS");
      EnqueueTasks = (env_var != nullptr);

#ifdef DEPSPAWN_FAST_START
      env_var = getenv("DEPSPAWN_TASK_QUEUE_LIMIT");
      FAST_THRESHOLD_ExplicitlySet = (env_var != nullptr);
      FAST_THRESHOLD = FAST_THRESHOLD_ExplicitlySet ? strtol(env_var, 0, 0) : (Nthreads * 2);
      if (FAST_THRESHOLD < 0) {
        throw std::invalid_argument("Invalid DEPSPAWN_TASK_QUEUE_LIMIT");
      }
#endif
    }